

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  long lVar1;
  Pgno *pPVar2;
  byte bVar3;
  byte bVar4;
  u8 uVar5;
  ushort uVar6;
  ushort uVar7;
  PgHdr *pPVar8;
  void *pvVar9;
  u16 uVar10;
  u16 uVar11;
  ushort uVar12;
  Pgno PVar13;
  u32 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  u8 **ppuVar19;
  u8 **ppuVar20;
  uint uVar21;
  undefined1 *puVar22;
  u8 *puVar23;
  long lVar24;
  MemPage **ppMVar25;
  uint uVar26;
  int iVar27;
  MemPage *pMVar28;
  u8 *puVar29;
  MemPage *pMVar30;
  u8 **ppuVar31;
  ulong uVar32;
  u8 *puVar33;
  uint *puVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  u8 *puVar38;
  u8 **ppuVar39;
  uint uVar40;
  MemPage *pMVar41;
  ulong uVar42;
  uint uVar43;
  BtShared *pBVar44;
  i8 iVar45;
  u8 **ppuVar46;
  MemPage *pFrom;
  size_t __n;
  long lVar47;
  uint uVar48;
  u8 **ppuVar49;
  bool bVar50;
  Pgno local_294;
  u8 **local_290;
  MemPage *local_288;
  MemPage *local_280;
  u8 **local_278;
  uint *local_270;
  u8 *local_268;
  char local_259;
  BtCursor *local_258;
  ulong local_250;
  Pgno local_244;
  MemPage *local_240;
  MemPage *local_238;
  BtShared *local_230;
  u8 **local_228;
  MemPage *local_220;
  ulong local_218;
  u8 **local_210;
  MemPage *apOld [3];
  int cntNew [5];
  CellArray local_1c8;
  int szNew [5];
  u8 abDone [5];
  char local_178;
  uint local_168;
  void *local_150;
  void *local_140;
  MemPage *pNew;
  ulong local_130 [5];
  MemPage *local_108;
  uint *local_100;
  Pgno pgnoNew;
  uint local_dc;
  Pgno aPgOrder [5];
  int cntOld [5];
  long lStack_a0;
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  
  local_dc = (pCur->pBt->usableSize * 2) / 3;
  iVar45 = pCur->iPage;
  local_150 = (void *)0x0;
  pFrom = pCur->pPage;
  local_258 = pCur;
LAB_00150624:
  if (iVar45 == '\0') {
    if (pFrom->nOverflow == '\0') goto LAB_00151ffa;
    pNew = (MemPage *)0x0;
    apOld[0]._0_4_ = 0;
    pBVar44 = pFrom->pBt;
    PVar13 = sqlite3PagerWrite(pFrom->pDbPage);
    if (PVar13 == 0) {
      iVar15 = allocateBtreePage(pBVar44,&pNew,(Pgno *)apOld,pFrom->pgno,'\0');
      pMVar30 = pNew;
      local_1c8.nCell = iVar15;
      copyNodeContent(pFrom,pNew,&local_1c8.nCell);
      if (pBVar44->autoVacuum != '\0') {
        ptrmapPut(pBVar44,(Pgno)apOld[0],'\x05',pFrom->pgno,&local_1c8.nCell);
      }
      PVar13 = local_1c8.nCell;
      if (local_1c8.nCell != 0) goto LAB_00152003;
      memcpy(pMVar30->aiOvfl,pFrom->aiOvfl,(ulong)((uint)pFrom->nOverflow * 2));
      memcpy(pMVar30->apOvfl,pFrom->apOvfl,(ulong)pFrom->nOverflow << 3);
      pMVar30->nOverflow = pFrom->nOverflow;
      zeroPage(pFrom,*pMVar30->aData & 0xfffffff7);
      *(Pgno *)(pFrom->aData + (ulong)pFrom->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      pCur->apPage[1] = pMVar30;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      pCur->apPage[0] = pFrom;
      PVar13 = 0;
      iVar45 = '\x01';
      goto LAB_00151233;
    }
    pMVar30 = (MemPage *)0x0;
LAB_00152003:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar30);
  }
  else {
    if ((pFrom->nOverflow != '\0') || (local_dc < pFrom->nFree)) {
      pMVar30 = pCur->apPage[(long)iVar45 + -1];
      uVar12 = pCur->aiIdx[(long)iVar45 + -1];
      PVar13 = sqlite3PagerWrite(pMVar30->pDbPage);
      if (PVar13 == 0) {
        local_259 = iVar45;
        local_238 = pMVar30;
        if ((((pFrom->intKeyLeaf != '\0') && (pFrom->nOverflow == '\x01')) &&
            (pFrom->aiOvfl[0] == pFrom->nCell)) &&
           ((pMVar30->pgno != 1 && (pMVar30->nCell == uVar12)))) {
          if (pFrom->aiOvfl[0] == 0) {
            PVar13 = sqlite3CorruptError(0x11049);
          }
          else {
            pBVar44 = pFrom->pBt;
            PVar13 = allocateBtreePage(pBVar44,&pNew,&pgnoNew,0,'\0');
            if (PVar13 == 0) {
              puVar29 = pFrom->apOvfl[0];
              local_1c8._0_8_ = puVar29;
              uVar10 = (*pFrom->xCellSize)(pFrom,puVar29);
              pMVar30 = pNew;
              cntNew[0] = CONCAT22(cntNew[0]._2_2_,uVar10);
              zeroPage(pNew,0xd);
              PVar13 = rebuildPage(pMVar30,1,(u8 **)&local_1c8,(u16 *)cntNew);
              apOld[0]._0_4_ = PVar13;
              if (PVar13 == 0) {
                pMVar30->nFree = ((short)pBVar44->usableSize - (pMVar30->cellOffset + uVar10)) - 2;
                if (pBVar44->autoVacuum != '\0') {
                  ptrmapPut(pBVar44,pgnoNew,'\x05',local_238->pgno,(int *)apOld);
                  if (pMVar30->minLocal < uVar10) {
                    ptrmapPutOvflPtr(pMVar30,puVar29,(int *)apOld);
                  }
                }
                pMVar28 = local_238;
                uVar32 = (ulong)(CONCAT11(pFrom->aCellIdx[(ulong)pFrom->nCell * 2 + -2],
                                          pFrom->aCellIdx[(ulong)pFrom->nCell * 2 + -1]) &
                                pFrom->maskPage);
                uVar42 = 0;
                puVar29 = pFrom->aData + uVar32;
                puVar38 = pFrom->aData + uVar32 + 2;
                do {
                  puVar33 = puVar38;
                  puVar23 = puVar29;
                  if (7 < uVar42) break;
                  uVar42 = uVar42 + 1;
                  puVar29 = puVar23 + 1;
                  puVar38 = puVar33 + 1;
                } while ((char)*puVar23 < '\0');
                lVar24 = 4;
                do {
                  uVar5 = puVar33[-1];
                  aBalanceQuickSpace[lVar24] = uVar5;
                  lVar24 = lVar24 + 1;
                  if (-1 < (char)uVar5) break;
                  bVar50 = puVar33 < puVar23 + 10;
                  puVar33 = puVar33 + 1;
                } while (bVar50);
                if ((Pgno)apOld[0] == 0) {
                  insertCell(local_238,(uint)local_238->nCell,aBalanceQuickSpace,(int)lVar24,
                             (u8 *)0x0,pFrom->pgno,(int *)apOld);
                }
                PVar13 = (Pgno)apOld[0];
                *(Pgno *)(pMVar28->aData + (ulong)pMVar28->hdrOffset + 8) =
                     pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                     pgnoNew << 0x18;
                releasePage(pMVar30);
              }
            }
          }
          goto LAB_0015120f;
        }
        local_140 = pcache1Alloc(pCur->pBt->pageSize);
        pMVar30 = local_238;
        abDone[0] = '\0';
        abDone[1] = '\0';
        abDone[2] = '\0';
        abDone[3] = '\0';
        local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
        local_1c8.apCell = (u8 **)0x0;
        abDone[4] = '\0';
        PVar13 = 7;
        if (local_140 != (void *)0x0) {
          uVar40 = pCur->hints & 1;
          uVar48 = (uint)local_238->nCell + (uint)local_238->nOverflow;
          local_240 = (MemPage *)0x0;
          if (1 < uVar48) {
            uVar26 = (uint)uVar12;
            if (uVar26 == 0) {
              local_240 = (MemPage *)0x0;
            }
            else if (uVar48 == uVar26) {
              local_240 = (MemPage *)(ulong)((uVar12 + uVar40) - 2);
            }
            else {
              local_240 = (MemPage *)(ulong)(uVar26 - 1);
            }
            uVar48 = 2 - uVar40;
          }
          ppuVar31 = (u8 **)(ulong)uVar48;
          uVar26 = ((int)local_240 - (uint)local_238->nOverflow) + uVar48;
          if (uVar26 == local_238->nCell) {
            uVar32 = (ulong)local_238->hdrOffset + 8;
          }
          else {
            uVar32 = (ulong)(CONCAT11(local_238->aCellIdx[(long)(int)uVar26 * 2],
                                      local_238->aCellIdx[(long)(int)uVar26 * 2 + 1]) &
                            local_238->maskPage);
          }
          local_100 = (uint *)(local_238->aData + uVar32);
          pBVar44 = local_238->pBt;
          local_268 = (u8 *)CONCAT44(local_268._4_4_,uVar48 + 1);
          uVar14 = sqlite3Get4byte((u8 *)local_100);
          __n = (size_t)(uVar48 * 8);
          uVar26 = (int)local_240 + -1 + uVar48;
          local_270 = (uint *)(szNew + (long)ppuVar31 + -1);
          local_288 = (MemPage *)0x0;
          local_290 = ppuVar31;
          local_230 = pBVar44;
          while( true ) {
            local_294 = getAndInitPage(pBVar44,uVar14,(MemPage **)((long)apOld + __n),
                                       (BtCursor *)0x0,0);
            local_278 = (u8 **)((ulong)local_268 & 0xffffffff);
            if (local_294 != 0) break;
            lVar24 = (ulong)*(byte *)(*(long *)((long)apOld + __n) + 0xc) +
                     (long)(int)local_288 + (ulong)*(ushort *)(*(long *)((long)apOld + __n) + 0x16);
            pMVar28 = (MemPage *)(lVar24 + 1);
            if (__n == 0) {
              pMVar30 = (MemPage *)(lVar24 + 4U & 0xfffffffffffffffc);
              local_244 = uVar14;
              ppuVar19 = (u8 **)sqlite3Malloc((long)(int)((int)pMVar30 * 10 + pBVar44->pageSize));
              local_1c8.apCell = ppuVar19;
              if (ppuVar19 != (u8 **)0x0) {
                ppuVar20 = ppuVar19 + (long)pMVar30;
                local_1c8.szCell = (u16 *)ppuVar20;
                pMVar28 = (MemPage *)CONCAT44(apOld[0]._4_4_,(Pgno)apOld[0]);
                local_1c8.pRef = pMVar28;
                bVar3 = pMVar28->leaf;
                local_250 = (ulong)bVar3 << 2;
                local_280 = (MemPage *)(ulong)pMVar28->intKeyLeaf;
                local_270 = (uint *)0x0;
                ppuVar39 = (u8 **)0x0;
                uVar26 = 0;
                local_218 = 0;
                ppuVar46 = ppuVar20;
                local_290 = ppuVar19;
                local_288 = pMVar30;
                local_210 = ppuVar20;
                goto LAB_00150c37;
              }
              local_294 = 7;
              ppuVar19 = (u8 **)0x0;
              ppuVar49 = local_278;
              pCur = local_258;
              uVar40 = 0;
              PVar13 = local_294;
              goto LAB_00151199;
            }
            local_290 = (u8 **)((long)local_290 + -1);
            uVar35 = uVar26;
            local_288 = pMVar28;
            if (pMVar30->nOverflow == 0) {
LAB_00150a89:
              lVar24 = (long)(int)(uVar35 - pMVar30->nOverflow);
              puVar29 = pMVar30->aData +
                        (CONCAT11(pMVar30->aCellIdx[lVar24 * 2],pMVar30->aCellIdx[lVar24 * 2 + 1]) &
                        pMVar30->maskPage);
              *(u8 **)((long)&lStack_a0 + __n) = puVar29;
              uVar14 = sqlite3Get4byte(puVar29);
              local_220 = (MemPage *)CONCAT44(local_220._4_4_,uVar14);
              uVar10 = (*pMVar30->xCellSize)(pMVar30,puVar29);
              *local_270 = (uint)uVar10;
              pvVar9 = local_140;
              if ((pBVar44->btsFlags & 0xc) != 0) {
                iVar15 = (int)puVar29 - *(int *)&pMVar30->aData;
                if ((int)local_230->usableSize < (int)(iVar15 + (uint)uVar10)) {
                  local_244 = (u32)local_220;
                  local_294 = sqlite3CorruptError(0x1119e);
                  goto LAB_00150eef;
                }
                memcpy((void *)((long)iVar15 + (long)local_140),puVar29,(ulong)(uint)uVar10);
                *(long *)((long)&lStack_a0 + __n) =
                     ((long)puVar29 - (long)local_238->aData) + (long)pvVar9;
                pMVar30 = local_238;
              }
              dropCell(pMVar30,uVar35 - pMVar30->nOverflow,(uint)uVar10,(int *)&local_294);
              pBVar44 = local_230;
              uVar14 = (u32)local_220;
            }
            else {
              if (uVar26 != pMVar30->aiOvfl[0]) {
                uVar35 = (int)local_240 + (int)local_290;
                goto LAB_00150a89;
              }
              puVar29 = pMVar30->apOvfl[0];
              *(u8 **)((long)&lStack_a0 + __n) = puVar29;
              uVar14 = sqlite3Get4byte(puVar29);
              uVar10 = (*pMVar30->xCellSize)(pMVar30,puVar29);
              *local_270 = (uint)uVar10;
              pMVar30->nOverflow = '\0';
            }
            __n = __n - 8;
            uVar26 = uVar26 - 1;
            local_270 = local_270 + -1;
          }
          __n = __n + 8;
          local_244 = uVar14;
LAB_00150eef:
          ppuVar19 = (u8 **)0x0;
          memset(apOld,0,__n);
          ppuVar49 = local_278;
          pCur = local_258;
          uVar40 = 0;
          PVar13 = local_294;
          goto LAB_00151199;
        }
        goto LAB_001511ed;
      }
      goto LAB_0015120f;
    }
LAB_00151ffa:
    PVar13 = 0;
  }
  goto LAB_00152013;
LAB_00150c37:
  pCur = local_258;
  ppuVar49 = local_278;
  local_168 = (uint)local_250 & 0xffff;
  if (ppuVar39 == local_278) goto LAB_00150f24;
  pMVar41 = apOld[(long)ppuVar39];
  puVar29 = pMVar41->aData;
  if (*puVar29 != *pMVar28->aData) {
    PVar13 = sqlite3CorruptError(0x111df);
    ppuVar19 = local_290;
    ppuVar49 = local_278;
    uVar40 = 0;
    goto LAB_00151199;
  }
  uVar12 = pMVar41->maskPage;
  puVar38 = puVar29 + pMVar41->cellOffset;
  uVar32 = (ulong)(int)uVar26;
  local_228 = ppuVar39;
  local_220 = pMVar41;
  memset((void *)((long)ppuVar46 + uVar32 * 2),0,
         (ulong)(((uint)pMVar41->nOverflow + (uint)pMVar41->nCell) * 2));
  ppuVar46 = local_210;
  ppuVar39 = local_228;
  bVar4 = local_220->nOverflow;
  if ((ulong)bVar4 == 0) {
    uVar26 = (uint)local_270;
  }
  else {
    uVar35 = (uint)local_220->aiOvfl[0];
    lVar24 = uVar32 << 0x20;
    ppuVar49 = local_290 + uVar32;
    while (bVar50 = uVar35 != 0, uVar35 = uVar35 - 1, bVar50) {
      local_290[uVar32] = puVar29 + (CONCAT11(*puVar38,puVar38[1]) & uVar12);
      puVar38 = puVar38 + 2;
      uVar32 = uVar32 + 1;
      lVar24 = lVar24 + 0x100000000;
      uVar26 = uVar26 + 1;
      ppuVar49 = ppuVar49 + 1;
    }
    for (uVar32 = 0; bVar4 != uVar32; uVar32 = uVar32 + 1) {
      *ppuVar49 = local_220->apOvfl[uVar32];
      lVar24 = lVar24 + 0x100000000;
      uVar26 = uVar26 + 1;
      ppuVar49 = ppuVar49 + 1;
    }
    local_1c8.nCell = uVar26;
    uVar32 = lVar24 >> 0x20;
  }
  uVar6 = local_220->cellOffset;
  uVar7 = local_220->nCell;
  lVar24 = uVar32 << 0x20;
  for (; puVar38 < puVar29 + (ulong)uVar7 * 2 + (ulong)uVar6; puVar38 = puVar38 + 2) {
    local_290[uVar32] = puVar29 + (uVar12 & CONCAT11(*puVar38,puVar38[1]));
    uVar32 = uVar32 + 1;
    uVar26 = (uint)uVar32;
    local_1c8.nCell = uVar26;
    lVar24 = lVar24 + 0x100000000;
  }
  cntOld[(long)local_228] = (int)uVar32;
  if ((local_228 < ppuVar31) && ((char)local_280 == '\0')) {
    uVar26 = szNew[(long)local_228] & 0xffff;
    lVar47 = lVar24 >> 0x1f;
    *(short *)((long)local_210 + lVar47) = (short)szNew[(long)local_228];
    local_270 = (uint *)((long)ppuVar20 + (long)(int)local_218 + (long)pMVar30 * 2);
    uVar35 = (int)local_218 + uVar26;
    uVar42 = (ulong)uVar35;
    memcpy(local_270,apDiv[(long)local_228],(ulong)uVar26);
    *(undefined4 **)((long)local_290 + (lVar24 >> 0x1d)) =
         (undefined4 *)((long)local_270 + local_250);
    iVar15 = *(ushort *)((long)ppuVar46 + lVar47) - local_168;
    *(short *)((long)ppuVar46 + lVar47) = (short)iVar15;
    if (local_220->leaf == '\0') {
      *(undefined4 *)((long)local_270 + local_250) = *(undefined4 *)(local_220->aData + 8);
      local_218 = uVar42;
    }
    else {
      puVar22 = (undefined1 *)((long)ppuVar19 + (long)(int)uVar35 + (long)pMVar30 * 10);
      while (local_218 = uVar42, (ushort)iVar15 < 4) {
        *puVar22 = 0;
        iVar15 = *(ushort *)((long)ppuVar46 + (lVar24 >> 0x20) * 2) + 1;
        *(short *)((long)ppuVar46 + (lVar24 >> 0x20) * 2) = (short)iVar15;
        uVar42 = (ulong)((int)uVar42 + 1);
        puVar22 = puVar22 + 1;
      }
    }
    uVar26 = (int)uVar32 + 1;
    uVar32 = (ulong)uVar26;
    local_1c8.nCell = uVar26;
  }
  ppuVar39 = (u8 **)((long)ppuVar39 + 1);
  local_270 = (uint *)(ulong)uVar26;
  uVar26 = (uint)uVar32;
  pBVar44 = local_230;
  goto LAB_00150c37;
LAB_00150f24:
  local_220 = (MemPage *)
              CONCAT44(local_220._4_4_,pBVar44->usableSize + (uint)(ushort)local_250 + -0xc);
  for (ppuVar19 = (u8 **)0x0; ppuVar19 != ppuVar49; ppuVar19 = (u8 **)((long)ppuVar19 + 1)) {
    pMVar30 = apOld[(long)ppuVar19];
    iVar15 = (u32)local_220 - pMVar30->nFree;
    szNew[(long)ppuVar19] = iVar15;
    for (uVar32 = 0; uVar32 < pMVar30->nOverflow; uVar32 = uVar32 + 1) {
      uVar10 = (*pMVar30->xCellSize)(pMVar30,pMVar30->apOvfl[uVar32]);
      iVar15 = iVar15 + (uint)uVar10 + 2;
      szNew[(long)ppuVar19] = iVar15;
    }
    cntNew[(long)ppuVar19] = cntOld[(long)ppuVar19];
    pBVar44 = local_230;
  }
  ppuVar20 = (u8 **)((ulong)local_268 & 0xffffffff);
  ppuVar19 = (u8 **)0x0;
LAB_00150fb4:
  do {
    pMVar30 = local_288;
    ppuVar39 = local_290;
    iVar15 = (int)ppuVar20;
    if ((long)iVar15 <= (long)ppuVar19) {
      iVar36 = (int)local_280;
      lVar24 = (long)local_288 * 8;
      local_108 = (MemPage *)(ulong)(iVar15 - 1);
      pMVar41 = (MemPage *)(ulong)(iVar15 - 1);
      break;
    }
    iVar15 = szNew[(long)ppuVar19];
    local_228 = (u8 **)((long)ppuVar19 + 1);
    local_250 = CONCAT44(local_250._4_4_,(int)ppuVar19 + 2);
    for (; (int)(u32)local_220 < iVar15; iVar15 = iVar15 - (uVar10 + 2)) {
      if ((int)ppuVar20 <= (int)local_228) {
        if ((u8 **)0x3 < ppuVar19) {
          szNew[(long)ppuVar19] = iVar15;
          PVar13 = sqlite3CorruptError(0x1124c);
          ppuVar19 = local_290;
          ppuVar49 = local_278;
          pCur = local_258;
          uVar40 = 0;
          goto LAB_00151199;
        }
        szNew[(long)ppuVar19 + 1] = 0;
        cntNew[(long)ppuVar19 + 1] = (int)local_270;
        ppuVar20 = (u8 **)(local_250 & 0xffffffff);
      }
      iVar36 = cntNew[(long)ppuVar19];
      uVar10 = cachedCellSize(&local_1c8,iVar36 + -1);
      iVar16 = uVar10 + 2;
      if ((int)local_280 == 0) {
        iVar16 = 0;
        if (iVar36 < (int)local_270) {
          uVar11 = cachedCellSize(&local_1c8,iVar36);
          iVar16 = uVar11 + 2;
        }
      }
      szNew[(long)ppuVar19 + 1] = szNew[(long)ppuVar19 + 1] + iVar16;
      cntNew[(long)ppuVar19] = iVar36 + -1;
    }
    szNew[(long)ppuVar19] = iVar15;
    iVar36 = cntNew[(long)ppuVar19];
    while (iVar36 < (int)local_270) {
      uVar12 = cachedCellSize(&local_1c8,iVar36);
      ppuVar49 = local_278;
      iVar15 = iVar15 + (uint)uVar12 + 2;
      if ((int)(u32)local_220 < iVar15) {
        cntNew[(long)ppuVar19] = iVar36;
        if (ppuVar19 == (u8 **)0x0) {
          iVar15 = 0;
        }
        else {
          iVar15 = cntNew[(long)ppuVar19 + -1];
        }
        pBVar44 = local_230;
        ppuVar19 = local_228;
        if (iVar15 < iVar36) goto LAB_00150fb4;
        PVar13 = sqlite3CorruptError(0x1126d);
        ppuVar19 = local_290;
        pCur = local_258;
        uVar40 = 0;
        goto LAB_00151199;
      }
      iVar36 = iVar36 + 1;
      szNew[(long)ppuVar19] = iVar15;
      if ((int)local_280 == 0) {
        iVar16 = 0;
        if (iVar36 < (int)local_270) {
          uVar12 = cachedCellSize(&local_1c8,iVar36);
          goto LAB_001510e4;
        }
      }
      else {
LAB_001510e4:
        iVar16 = uVar12 + 2;
      }
      szNew[(long)ppuVar19 + 1] = szNew[(long)ppuVar19 + 1] - iVar16;
    }
    cntNew[(long)ppuVar19] = iVar36;
    ppuVar20 = local_228;
    pBVar44 = local_230;
    ppuVar49 = local_278;
    ppuVar19 = local_228;
  } while( true );
  do {
    local_178 = (char)uVar40;
    if ((int)pMVar41 < 1) {
      local_288 = (MemPage *)CONCAT44(local_288._4_4_,(uint)*pMVar28->aData);
      ppuVar39 = (u8 **)0x0;
      ppuVar20 = (u8 **)((ulong)ppuVar20 & 0xffffffff);
      if (iVar15 < 1) {
        ppuVar20 = ppuVar39;
      }
      uVar26 = 0;
      goto LAB_00151469;
    }
    iVar16 = szNew[(long)((long)&pMVar41[-1].xParseCell + 7)];
    iVar37 = szNew[(long)pMVar41];
    local_288 = (MemPage *)((long)&pMVar41[-1].xParseCell + 7);
    iVar27 = cntNew[(long)((long)&pMVar41[-1].xParseCell + 7)];
    uVar42 = (ulong)iVar27;
    cachedCellSize(&local_1c8,iVar27 - (int)local_280);
    bVar50 = pMVar41 == local_108;
    local_250 = (long)ppuVar39 + uVar42 * 2 + (lVar24 - (ulong)(uint)(iVar36 * 2));
    local_228 = (u8 **)(ulong)(iVar27 - 1);
    local_218 = (long)ppuVar39 + uVar42 * 2 + (long)pMVar30 * 8;
    lVar47 = 0;
    uVar32 = uVar42;
    do {
      uVar26 = (uint)uVar32;
      iVar27 = (int)local_228 + (int)lVar47;
      cachedCellSize(&local_1c8,iVar27);
      ppuVar49 = local_278;
      ppuVar19 = local_290;
      if (iVar37 == 0) {
        uVar12 = *(ushort *)(local_218 + lVar47 * 2 + -2);
        iVar17 = *(ushort *)(local_250 + lVar47 * 2) + 2;
      }
      else {
        if (local_178 != '\0') break;
        iVar17 = (uint)*(ushort *)(local_250 + lVar47 * 2) + iVar37 + 2;
        uVar12 = *(ushort *)(local_218 + lVar47 * 2 + -2);
        if ((int)(((bVar50 - 2) + (uint)bVar50 + iVar16) - (uint)uVar12) < iVar17) break;
      }
      iVar37 = iVar17;
      iVar16 = (iVar16 - (uint)uVar12) + -2;
      cntNew[(long)local_288] = iVar27;
      uVar26 = uVar26 - 1;
      uVar32 = (ulong)uVar26;
      lVar1 = uVar42 + lVar47;
      lVar47 = lVar47 + -1;
    } while (1 < lVar1);
    szNew[(long)pMVar41] = iVar37;
    szNew[(long)local_288] = iVar16;
    iVar16 = 0;
    if (pMVar41 != (MemPage *)0x1) {
      iVar16 = cntNew[(int)pMVar41 - 2];
    }
    pMVar41 = local_288;
    pBVar44 = local_230;
  } while (iVar16 < (int)uVar26);
  PVar13 = sqlite3CorruptError(0x11297);
  pCur = local_258;
  uVar40 = 0;
LAB_00151199:
  local_294 = PVar13;
  sqlite3DbFree((sqlite3 *)0x0,ppuVar19);
  for (ppuVar31 = (u8 **)0x0; ppuVar49 != ppuVar31; ppuVar31 = (u8 **)((long)ppuVar31 + 1)) {
    releasePage(apOld[(long)ppuVar31]);
  }
  if ((int)uVar40 < 1) {
    uVar40 = 0;
  }
  for (uVar32 = 0; PVar13 = local_294, uVar40 != uVar32; uVar32 = uVar32 + 1) {
    releasePage((MemPage *)local_130[uVar32 - 1]);
  }
LAB_001511ed:
  if (local_150 != (void *)0x0) {
    pcache1Free(local_150);
  }
  local_150 = local_140;
LAB_0015120f:
  pFrom->nOverflow = '\0';
  releasePage(pFrom);
  iVar45 = pCur->iPage + -1;
  pCur->iPage = iVar45;
  pMVar30 = pCur->apPage[iVar45];
LAB_00151233:
  pCur->pPage = pMVar30;
  pFrom = pMVar30;
  if (PVar13 != 0) {
LAB_00152013:
    if (local_150 != (void *)0x0) {
      pcache1Free(local_150);
    }
    return PVar13;
  }
  goto LAB_00150624;
LAB_00151469:
  pCur = local_258;
  uVar40 = uVar26;
  if (ppuVar20 == ppuVar39) goto LAB_0015168c;
  if (ppuVar31 < ppuVar39) {
    PVar13 = 1;
    if (local_178 == '\0') {
      PVar13 = local_244;
    }
    local_294 = allocateBtreePage(pBVar44,(MemPage **)&pgnoNew,&local_244,PVar13,'\0');
    pMVar30 = _pgnoNew;
    ppuVar19 = local_290;
    pCur = local_258;
    PVar13 = local_294;
    if (local_294 != 0) goto LAB_00151199;
    zeroPage(_pgnoNew,(int)local_288);
    local_130[(long)ppuVar39 + -1] = (ulong)pMVar30;
    cntOld[(long)ppuVar39] = (int)local_270;
    if (pBVar44->autoVacuum != '\0') {
      ptrmapPut(pBVar44,pMVar30->pgno,'\x05',local_238->pgno,(int *)&local_294);
      goto joined_r0x0015150f;
    }
  }
  else {
    pMVar30 = apOld[(long)ppuVar39];
    local_130[(long)ppuVar39 + -1] = (ulong)pMVar30;
    apOld[(long)ppuVar39] = (MemPage *)0x0;
    local_294 = sqlite3PagerWrite(pMVar30->pDbPage);
joined_r0x0015150f:
    ppuVar19 = local_290;
    pCur = local_258;
    uVar40 = uVar26 + 1;
    PVar13 = local_294;
    if (local_294 != 0) goto LAB_00151199;
  }
  uVar26 = uVar26 + 1;
  ppuVar39 = (u8 **)((long)ppuVar39 + 1);
  goto LAB_00151469;
LAB_0015168c:
  ppuVar19 = (u8 **)0x0;
  if (0 < (int)uVar26) {
    ppuVar19 = (u8 **)(ulong)uVar26;
  }
  for (ppuVar20 = (u8 **)0x0; ppuVar20 != ppuVar19; ppuVar20 = (u8 **)((long)ppuVar20 + 1)) {
    uVar32 = local_130[(long)ppuVar20 + -1];
    PVar13 = *(Pgno *)(uVar32 + 4);
    aPgno[(long)ppuVar20] = PVar13;
    aPgOrder[(long)ppuVar20] = PVar13;
    aPgFlags[(long)ppuVar20] = *(u16 *)(*(long *)(uVar32 + 0x70) + 0x34);
    ppuVar39 = (u8 **)0x0;
    while (ppuVar20 != ppuVar39) {
      pPVar2 = aPgno + (long)ppuVar39;
      ppuVar39 = (u8 **)((long)ppuVar39 + 1);
      if (*pPVar2 == PVar13) {
        PVar13 = sqlite3CorruptError(0x112e1);
        ppuVar19 = local_290;
        goto LAB_00151199;
      }
    }
  }
  PVar13 = local_244;
  local_228 = ppuVar19;
  for (ppuVar49 = (u8 **)0x0; ppuVar49 != local_228; ppuVar49 = (u8 **)((long)ppuVar49 + 1)) {
    ppuVar19 = (u8 **)0x0;
    uVar32 = 1;
    while( true ) {
      lVar24 = (long)(int)ppuVar19;
      if (uVar26 == uVar32) break;
      ppuVar20 = (u8 **)(uVar32 & 0xffffffff);
      if (aPgOrder[lVar24] <= aPgOrder[uVar32]) {
        ppuVar20 = ppuVar19;
      }
      ppuVar19 = ppuVar20;
      uVar32 = uVar32 + 1;
    }
    PVar13 = aPgOrder[lVar24];
    aPgOrder[lVar24] = 0xffffffff;
    if (ppuVar49 != ppuVar19) {
      if ((long)ppuVar49 < lVar24) {
        pPVar8 = *(PgHdr **)(local_130[lVar24 + -1] + 0x70);
        uVar14 = local_230->nPage;
        pPVar8->flags = 0;
        sqlite3PcacheMove(pPVar8,(int)ppuVar19 + uVar14 + 1);
      }
      uVar32 = local_130[(long)ppuVar49 + -1];
      pPVar8 = *(PgHdr **)(uVar32 + 0x70);
      pPVar8->flags = aPgFlags[lVar24];
      sqlite3PcacheMove(pPVar8,PVar13);
      *(Pgno *)(uVar32 + 4) = PVar13;
    }
    pBVar44 = local_230;
  }
  pvVar9 = (&local_140)[(int)uVar26];
  uVar35 = *(uint *)((long)pvVar9 + 4);
  *local_100 = uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 | uVar35 << 0x18;
  if ((((ulong)local_288 & 8) == 0) && ((uint)local_268 != uVar26)) {
    ppMVar25 = apOld;
    if ((int)(uint)local_268 < (int)uVar26) {
      ppMVar25 = &pNew;
    }
    *(undefined4 *)(*(long *)((long)pvVar9 + 0x50) + 8) =
         *(undefined4 *)(ppMVar25[(long)ppuVar31]->aData + 8);
  }
  local_100 = (uint *)(long)(int)uVar26;
  local_244 = PVar13;
  if (pBVar44->autoVacuum != '\0') {
    local_268 = (u8 *)CONCAT44(local_268._4_4_,(uint)((int)local_280 == 0));
    puVar29 = pNew->aData;
    local_288 = pNew;
    uVar35 = (uint)pNew->nOverflow + (uint)pNew->nCell;
    local_250 = (ulong)(int)pBVar44->usableSize;
    uVar32 = 0;
    iVar15 = 0;
    ppuVar19 = (u8 **)0x0;
    while( true ) {
      local_290 = local_1c8.apCell;
      if ((long)(int)local_270 <= (long)uVar32) break;
      local_290 = ppuVar19;
      if (uVar32 == uVar35) {
        uVar21 = (int)ppuVar19 + 1;
        ppMVar25 = apOld;
        if ((int)uVar21 < (int)uVar26) {
          ppMVar25 = &pNew;
        }
        pMVar30 = ppMVar25[(long)(int)ppuVar19 + 1];
        uVar35 = uVar35 + (uint)local_268 + (uint)pMVar30->nCell + (uint)pMVar30->nOverflow;
        puVar29 = pMVar30->aData;
        local_290 = (u8 **)(ulong)uVar21;
      }
      puVar38 = local_1c8.apCell[uVar32];
      iVar36 = iVar15;
      if (uVar32 == (uint)cntNew[iVar15]) {
        iVar36 = iVar15 + 1;
        local_288 = (MemPage *)local_130[iVar15];
        iVar15 = iVar36;
        if ((int)local_280 != 0) goto LAB_001518f6;
      }
      else {
LAB_001518f6:
        iVar15 = iVar36;
        if (((((int)uVar26 <= (int)local_290) || (local_288->pgno != aPgno[(int)local_290])) ||
            (puVar38 < puVar29)) || (puVar29 + local_250 <= puVar38)) {
          if (bVar3 == 0) {
            uVar14 = sqlite3Get4byte(puVar38);
            ptrmapPut(local_230,uVar14,'\x05',local_288->pgno,(int *)&local_294);
          }
          uVar10 = cachedCellSize(&local_1c8,(int)uVar32);
          if (local_288->minLocal < uVar10) {
            ptrmapPutOvflPtr(local_288,puVar38,(int *)&local_294);
          }
          ppuVar19 = local_1c8.apCell;
          ppuVar49 = local_278;
          pCur = local_258;
          PVar13 = local_294;
          if (local_294 != 0) goto LAB_00151199;
          local_270 = (uint *)(local_1c8._0_8_ & 0xffffffff);
        }
      }
      uVar32 = uVar32 + 1;
      ppuVar19 = local_290;
    }
    local_210 = (u8 **)local_1c8.szCell;
  }
  uVar42 = 0;
  uVar32 = (ulong)(uVar26 - 1);
  if ((int)(uVar26 - 1) < 1) {
    uVar32 = uVar42;
  }
  local_288 = (MemPage *)((ulong)local_240 & 0xffffffff);
  iVar15 = 0;
  for (; uVar32 != uVar42; uVar42 = uVar42 + 1) {
    pMVar30 = (MemPage *)local_130[uVar42 - 1];
    lVar24 = (long)cntNew[uVar42];
    puVar29 = local_290[lVar24];
    uVar12 = *(ushort *)((long)local_210 + lVar24 * 2);
    uVar35 = uVar12 + local_168;
    puVar33 = (u8 *)((long)iVar15 + (long)local_140);
    puVar38 = puVar33;
    if (pMVar30->leaf == '\0') {
      *(undefined4 *)(pMVar30->aData + 8) = *(undefined4 *)puVar29;
    }
    else if ((int)local_280 == 0) {
      puVar29 = puVar29 + -4;
      if (uVar12 == 4) {
        local_268 = puVar29;
        uVar10 = (*local_238->xCellSize)(local_238,puVar29);
        uVar35 = (uint)uVar10;
        puVar29 = local_268;
      }
    }
    else {
      (*pMVar30->xParseCell)(pMVar30,local_290[lVar24 + -1],(CellInfo *)&pgnoNew);
      iVar36 = sqlite3PutVarint(puVar33 + 4,(u64)_pgnoNew);
      uVar35 = iVar36 + 4;
      puVar38 = (u8 *)0x0;
      puVar29 = puVar33;
    }
    insertCell(local_238,(int)local_288 + (int)uVar42,puVar29,uVar35,puVar38,pMVar30->pgno,
               (int *)&local_294);
    ppuVar19 = local_290;
    ppuVar49 = local_278;
    pCur = local_258;
    PVar13 = local_294;
    if (local_294 != 0) goto LAB_00151199;
    iVar15 = iVar15 + uVar35;
  }
  bVar50 = (int)local_280 == 0;
  uVar35 = -uVar26;
  local_108 = (MemPage *)CONCAT44(local_108._4_4_,cntNew[0]);
  local_288 = local_1c8.pRef;
LAB_00151b03:
  do {
    pMVar28 = pNew;
    ppuVar19 = local_228;
    pBVar44 = local_230;
    pMVar30 = local_238;
    uVar35 = uVar35 + 1;
    if ((int)uVar26 <= (int)uVar35) break;
    uVar21 = -uVar35;
    if (0 < (int)uVar35) {
      uVar21 = uVar35;
    }
    if (abDone[uVar21] == '\0') {
      if ((int)uVar35 < 0) {
        if (cntOld[(long)(int)uVar21 + -1] < cntNew[(long)(int)uVar21 + -1]) goto LAB_00151b03;
LAB_00151b54:
        if (uVar48 < uVar21) {
          uVar32 = (ulong)(uVar21 - 1);
          uVar42 = (ulong)local_270 & 0xffffffff;
        }
        else {
          uVar32 = (ulong)(int)(uVar21 - 1);
          uVar42 = (ulong)(cntOld[uVar32] + (uint)bVar50);
        }
        iVar15 = cntNew[uVar32] + (uint)bVar50;
        uVar43 = cntNew[uVar21] - iVar15;
      }
      else {
        if (uVar35 != 0) goto LAB_00151b54;
        iVar15 = 0;
        uVar42 = 0;
        uVar43 = (uint)local_108;
      }
      local_268 = (u8 *)(ulong)uVar43;
      pMVar30 = (MemPage *)local_130[(ulong)uVar21 - 1];
      puVar29 = pMVar30->aData;
      local_218 = (ulong)pMVar30->hdrOffset;
      local_240 = (MemPage *)(pMVar30->aCellIdx + (int)(uVar43 * 2));
      uVar12 = pMVar30->nCell;
      bVar4 = pMVar30->nOverflow;
      iVar36 = (int)uVar42;
      uVar43 = (uint)uVar12;
      local_250 = CONCAT44(local_250._4_4_,iVar36);
      local_280 = pMVar30;
      if (iVar36 < iVar15) {
        iVar16 = pageFreeArray(pMVar30,iVar36,iVar15 - iVar36,&local_1c8);
        memmove(pMVar30->aCellIdx,pMVar30->aCellIdx + iVar16 * 2,(ulong)((uint)uVar12 * 2));
        uVar42 = local_250 & 0xffffffff;
        uVar43 = uVar43 - iVar16;
      }
      iVar16 = (uint)uVar12 + (int)uVar42 + (uint)bVar4;
      iVar27 = (int)local_268 + iVar15;
      iVar37 = iVar16 - iVar27;
      if (iVar37 != 0 && iVar27 <= iVar16) {
        iVar16 = pageFreeArray(local_280,iVar27,iVar37,&local_1c8);
        uVar42 = local_250 & 0xffffffff;
        uVar43 = uVar43 - iVar16;
      }
      pMVar30 = local_280;
      _pgnoNew = (MemPage *)
                 (puVar29 +
                 (ulong)((ushort)(*(ushort *)(puVar29 + 5 + local_218) << 8 |
                                 *(ushort *)(puVar29 + 5 + local_218) >> 8) - 1 & 0xffff) + 1);
      if (_pgnoNew < local_240) {
LAB_00151e06:
        lVar47 = (long)iVar15;
        lVar24 = lVar47 * 2;
        for (uVar32 = (ulong)local_268 & 0xffffffff; pMVar30 = local_280, 0 < (int)uVar32;
            uVar32 = (ulong)((int)uVar32 - 1)) {
          if (*(short *)((long)local_210 + lVar24) == 0) {
            uVar10 = (*local_288->xCellSize)(local_288,*(u8 **)((long)local_290 + lVar24 * 4));
            *(u16 *)((long)local_210 + lVar24) = uVar10;
          }
          lVar24 = lVar24 + 2;
        }
        PVar13 = rebuildPage(local_280,(int)local_268,local_290 + lVar47,
                             (u16 *)((long)local_210 + lVar47 * 2));
        ppuVar19 = local_290;
        ppuVar49 = local_278;
        pCur = local_258;
        if (PVar13 != 0) goto LAB_00151199;
      }
      else {
        if (iVar15 < (int)uVar42) {
          iVar16 = iVar36 - iVar15;
          if ((int)local_268 <= iVar36 - iVar15) {
            iVar16 = (int)local_268;
          }
          puVar38 = local_280->aCellIdx;
          memmove(puVar38 + iVar16 * 2,puVar38,(long)(int)(uVar43 * 2));
          iVar36 = pageInsertArray(pMVar30,&local_240->isInit,(u8 **)&pgnoNew,puVar38,iVar15,iVar16,
                                   &local_1c8);
          uVar42 = local_250 & 0xffffffff;
          if (iVar36 != 0) goto LAB_00151e06;
          uVar43 = uVar43 + iVar16;
        }
        pMVar30 = local_280;
        for (uVar32 = 0; uVar32 < pMVar30->nOverflow; uVar32 = uVar32 + 1) {
          iVar36 = (uint)pMVar30->aiOvfl[uVar32] + (int)uVar42;
          uVar18 = iVar36 - iVar15;
          if ((-1 < (int)uVar18) && ((int)uVar18 < (int)(uint)local_268)) {
            puVar38 = pMVar30->aCellIdx + (ulong)uVar18 * 2;
            memmove(pMVar30->aCellIdx + (ulong)uVar18 * 2 + 2,puVar38,
                    (long)(int)((uVar43 - uVar18) * 2));
            iVar36 = pageInsertArray(pMVar30,&local_240->isInit,(u8 **)&pgnoNew,puVar38,iVar36,1,
                                     &local_1c8);
            uVar42 = local_250 & 0xffffffff;
            if (iVar36 != 0) goto LAB_00151e06;
            uVar43 = uVar43 + 1;
            pMVar30 = local_280;
          }
        }
        iVar36 = pageInsertArray(pMVar30,&local_240->isInit,(u8 **)&pgnoNew,
                                 pMVar30->aCellIdx + (int)(uVar43 * 2),uVar43 + iVar15,
                                 (uint)local_268 - uVar43,&local_1c8);
        if (iVar36 != 0) goto LAB_00151e06;
        local_280->nCell = (u16)local_268;
        local_280->nOverflow = '\0';
        (puVar29 + 3)[local_218] = (u8)((ulong)local_268 >> 8);
        (puVar29 + 4)[local_218] = (u8)local_280->nCell;
        uVar12 = (short)_pgnoNew - (short)puVar29;
        *(ushort *)(puVar29 + 5 + local_218) = uVar12 * 0x100 | uVar12 >> 8;
        pMVar30 = local_280;
      }
      abDone[uVar21] = '\x01';
      pMVar30->nFree = (short)local_220 - (short)szNew[uVar21];
    }
  } while( true );
  local_294 = 0;
  if (((local_259 == '\x01') && (local_238->nCell == 0)) &&
     ((ushort)local_238->hdrOffset <= pNew->nFree)) {
    local_294 = defragmentPage(pNew,-1);
    copyNodeContent(pMVar28,pMVar30,(int *)&local_294);
    freePage(pMVar28,(int *)&local_294);
    puVar34 = local_100;
  }
  else {
    puVar34 = local_100;
    if (bVar3 == 0 && local_230->autoVacuum != '\0') {
      for (ppuVar49 = (u8 **)0x0; puVar34 = local_100, ppuVar19 != ppuVar49;
          ppuVar49 = (u8 **)((long)ppuVar49 + 1)) {
        uVar32 = local_130[(long)ppuVar49 + -1];
        uVar14 = sqlite3Get4byte((u8 *)(*(long *)(uVar32 + 0x50) + 8));
        ptrmapPut(pBVar44,uVar14,'\x05',*(Pgno *)(uVar32 + 4),(int *)&local_294);
      }
    }
  }
  for (; ppuVar19 = local_290, ppuVar49 = local_278, pCur = local_258, PVar13 = local_294,
      (long)puVar34 <= (long)ppuVar31; puVar34 = (uint *)((long)puVar34 + 1)) {
    freePage(apOld[(long)puVar34],(int *)&local_294);
  }
  goto LAB_00151199;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}